

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O3

void __thiscall
QTemporaryFileName::QTemporaryFileName(QTemporaryFileName *this,QString *templateName)

{
  char16_t cVar1;
  undefined1 *puVar2;
  qsizetype qVar3;
  long lVar4;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QString local_c0;
  NativePath local_a8;
  QString local_88;
  QFileSystemEntry local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->path).d.d = (Data *)0x0;
  (this->path).d.ptr = (char *)0x0;
  (this->path).d.size = 0;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::fromNativeSeparators(templateName);
  if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
    lVar4 = 0;
    puVar2 = (undefined1 *)local_88.d.size;
    while( true ) {
      while( true ) {
        puVar2 = puVar2 + -1;
        if ((&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(&local_88,local_88.d.size,KeepSize);
        }
        cVar1 = local_88.d.ptr[(long)puVar2];
        if (cVar1 == L'X') break;
        if (5 < lVar4) goto LAB_00258c4f;
        if ((&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(&local_88,local_88.d.size,KeepSize);
          cVar1 = local_88.d.ptr[(long)puVar2];
        }
        if ((cVar1 == L'/') || (puVar2 == (undefined1 *)0x0)) goto LAB_00258c39;
        lVar4 = 0;
      }
      if (puVar2 == (undefined1 *)0x0) break;
      lVar4 = lVar4 + 1;
    }
    if (4 < lVar4) goto LAB_00258c4f;
  }
LAB_00258c39:
  str.m_data = ".XXXXXX";
  str.m_size = 7;
  QString::append(&local_88,str);
LAB_00258c4f:
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QDir::cleanPath(&local_c0,&local_88);
  QFileSystemEntry::QFileSystemEntry(&local_68,&local_c0);
  QFileSystemEntry::nativeFilePath(&local_a8,&local_68);
  if (&(local_68.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_68.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_a8.d.size == (undefined1 *)0x0) {
    puVar2 = (undefined1 *)0x0;
    qVar3 = 0;
  }
  else {
    qVar3 = 0;
    puVar2 = (undefined1 *)local_a8.d.size;
    do {
      if ((&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(&local_a8,local_a8.d.size,KeepSize);
      }
      if (local_a8.d.ptr[(long)(puVar2 + -1)] == 'X') {
        qVar3 = qVar3 + 1;
      }
      else {
        if (5 < qVar3) goto LAB_00258d56;
        qVar3 = 0;
      }
      puVar2 = puVar2 + -1;
    } while (puVar2 != (undefined1 *)0x0);
    puVar2 = (undefined1 *)0x0;
  }
LAB_00258d56:
  QByteArray::operator=(&this->path,&local_a8);
  this->pos = (qsizetype)puVar2;
  this->length = qVar3;
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTemporaryFileName::QTemporaryFileName(const QString &templateName)
{
    // Ensure there is a placeholder mask
    QString qfilename = QDir::fromNativeSeparators(templateName);
    qsizetype phPos = qfilename.size();
    qsizetype phLength = 0;

    while (phPos != 0) {
        --phPos;

        if (qfilename[phPos] == u'X') {
            ++phLength;
            continue;
        }

        if (phLength >= 6
                || qfilename[phPos] == u'/') {
            ++phPos;
            break;
        }

        // start over
        phLength = 0;
    }

    if (phLength < 6)
        qfilename.append(".XXXXXX"_L1);

    // "Nativify" :-)
    QFileSystemEntry::NativePath filename =
            QFileSystemEntry(QDir::cleanPath(qfilename)).nativeFilePath();

    // Find mask in native path
    phPos = filename.size();
    phLength = 0;
    while (phPos != 0) {
        --phPos;

        if (filename[phPos] == Latin1Char('X')) {
            ++phLength;
            continue;
        }

        if (phLength >= 6) {
            ++phPos;
            break;
        }

        // start over
        phLength = 0;
    }

    Q_ASSERT(phLength >= 6);
    path = filename;
    pos = phPos;
    length = phLength;
}